

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  char *pcVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  TestNode *node;
  long *plVar5;
  TextureCubeArrayFilteringCase *pTVar6;
  long lVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong *puVar10;
  long *plVar11;
  ulong uVar12;
  char cVar13;
  long lVar15;
  string name_1;
  long *local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  undefined8 uStack_2e0;
  TextureFilteringTests *local_2d8;
  anon_struct_16_2_3f8b7511 *local_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  anon_struct_16_2_3f8b7511 *local_288;
  ulong *local_280;
  long local_278;
  ulong local_270;
  long lStack_268;
  char *local_260;
  TestNode *local_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  TestNode *local_230;
  uint local_228;
  deUint32 local_224;
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  long local_1e0;
  long local_1d8;
  TestNode *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  string name;
  ios_base local_138 [264];
  uint uVar14;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube_array",
             "Cube Map Array Texture Filtering");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  node = (TestNode *)operator_new(0x70);
  local_2d8 = this;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"formats",
             "Cube Map Array Texture Formats");
  local_258 = node;
  local_230 = pTVar4;
  tcu::TestNode::addChild(pTVar4,node);
  lVar7 = 0;
  do {
    local_288 = (anon_struct_16_2_3f8b7511 *)(ulong)init::filterableFormatsByType[lVar7].format;
    local_2d0 = (anon_struct_16_2_3f8b7511 *)init::filterableFormatsByType[lVar7].name;
    lVar15 = 8;
    local_260 = (char *)lVar7;
    do {
      dVar1 = *(deUint32 *)((long)&init::minFilterModes[0].name + lVar15);
      dVar2 = dVar1;
      if (dVar1 - 0x2602 < 0xfffffffe) {
        dVar2 = 0x2601;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,(char *)local_2d0,(allocator<char> *)&local_2f8);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        name_1.field_2._M_allocated_capacity = *psVar9;
        name_1.field_2._8_8_ = plVar5[3];
      }
      else {
        name_1.field_2._M_allocated_capacity = *psVar9;
        name_1._M_dataplus._M_p = (pointer)*plVar5;
      }
      name_1._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&name_1);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        name.field_2._M_allocated_capacity = *psVar9;
        name.field_2._8_8_ = plVar5[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar9;
        name._M_dataplus._M_p = (pointer)*plVar5;
      }
      name._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name_1._M_dataplus._M_p != &name_1.field_2) {
        operator_delete(name_1._M_dataplus._M_p,name_1.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      pTVar6 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
      TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                (pTVar6,(local_2d8->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 ::glcts::fixed_sample_locations_values + 1,dVar1,dVar2,0x2901,0x2901,
                 (deUint32)local_288,0x40,0xc,false);
      tcu::TestNode::addChild(local_258,(TestNode *)pTVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x68);
    lVar7 = (long)local_260 + 1;
  } while (lVar7 != 10);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (local_2d8->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sizes",
             "Texture Sizes");
  local_258 = pTVar4;
  tcu::TestNode::addChild(local_230,pTVar4);
  lVar7 = 0;
  do {
    local_2d0 = (anon_struct_16_2_3f8b7511 *)(ulong)(uint)init::sizesCubeArray[lVar7].size;
    local_288 = (anon_struct_16_2_3f8b7511 *)(ulong)(uint)init::sizesCubeArray[lVar7].depth;
    lVar15 = 8;
    local_260 = (char *)lVar7;
    do {
      dVar1 = *(deUint32 *)((long)&init::minFilterModes[0].name + lVar15);
      dVar2 = dVar1;
      if (dVar1 - 0x2602 < 0xfffffffe) {
        dVar2 = 0x2601;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      std::ostream::operator<<(&name,(int)local_2d0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base(local_138);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_1c8);
      local_250 = &local_240;
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_240 = *puVar10;
        lStack_238 = plVar5[3];
      }
      else {
        local_240 = *puVar10;
        local_250 = (ulong *)*plVar5;
      }
      local_248 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      std::ostream::operator<<(&name,(int)local_2d0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base(local_138);
      uVar12 = 0xf;
      if (local_250 != &local_240) {
        uVar12 = local_240;
      }
      if (uVar12 < (ulong)(local_1f8 + local_248)) {
        uVar12 = 0xf;
        if (local_200 != local_1f0) {
          uVar12 = local_1f0[0];
        }
        if (uVar12 < (ulong)(local_1f8 + local_248)) goto LAB_014dd4b3;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_250);
      }
      else {
LAB_014dd4b3:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_200);
      }
      local_2a8 = &local_298;
      plVar5 = puVar8 + 2;
      if ((long *)*puVar8 == plVar5) {
        local_298 = *plVar5;
        uStack_290 = puVar8[3];
      }
      else {
        local_298 = *plVar5;
        local_2a8 = (long *)*puVar8;
      }
      local_2a0 = puVar8[1];
      *puVar8 = plVar5;
      puVar8[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_280 = &local_270;
      puVar10 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar10) {
        local_270 = *puVar10;
        lStack_268 = plVar5[3];
      }
      else {
        local_270 = *puVar10;
        local_280 = (ulong *)*plVar5;
      }
      local_278 = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      std::ostream::operator<<(&name,(int)local_288);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base(local_138);
      uVar12 = 0xf;
      if (local_280 != &local_270) {
        uVar12 = local_270;
      }
      if (uVar12 < (ulong)(local_218 + local_278)) {
        uVar12 = 0xf;
        if (local_220 != local_210) {
          uVar12 = local_210[0];
        }
        if (uVar12 < (ulong)(local_218 + local_278)) goto LAB_014dd62e;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_280);
      }
      else {
LAB_014dd62e:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_220);
      }
      local_2f8 = &local_2e8;
      plVar5 = puVar8 + 2;
      if ((long *)*puVar8 == plVar5) {
        local_2e8 = *plVar5;
        uStack_2e0 = puVar8[3];
      }
      else {
        local_2e8 = *plVar5;
        local_2f8 = (long *)*puVar8;
      }
      local_2f0 = puVar8[1];
      *puVar8 = plVar5;
      puVar8[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2c8 = &local_2b8;
      plVar11 = plVar5 + 2;
      if ((long *)*plVar5 == plVar11) {
        local_2b8 = *plVar11;
        lStack_2b0 = plVar5[3];
      }
      else {
        local_2b8 = *plVar11;
        local_2c8 = (long *)*plVar5;
      }
      local_2c0 = plVar5[1];
      *plVar5 = (long)plVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        name_1.field_2._M_allocated_capacity = *psVar9;
        name_1.field_2._8_8_ = plVar5[3];
      }
      else {
        name_1.field_2._M_allocated_capacity = *psVar9;
        name_1._M_dataplus._M_p = (pointer)*plVar5;
      }
      name_1._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      if (local_280 != &local_270) {
        operator_delete(local_280,local_270 + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_200 != local_1f0) {
        operator_delete(local_200,local_1f0[0] + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,local_240 + 1);
      }
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      pTVar6 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
      TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                (pTVar6,(local_2d8->super_TestCaseGroup).m_context,name_1._M_dataplus._M_p,
                 ::glcts::fixed_sample_locations_values + 1,dVar1,dVar2,0x2901,0x2901,0x8058,
                 (int)local_2d0,(int)local_288,false);
      tcu::TestNode::addChild(local_258,(TestNode *)pTVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name_1._M_dataplus._M_p != &name_1.field_2) {
        operator_delete(name_1._M_dataplus._M_p,name_1.field_2._M_allocated_capacity + 1);
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x68);
    lVar7 = (long)local_260 + 1;
    if (lVar7 == 5) {
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,
                 (local_2d8->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "combinations","Filter and wrap mode combinations");
      local_1d0 = pTVar4;
      tcu::TestNode::addChild(local_230,pTVar4);
      lVar7 = 0;
      do {
        local_224 = init::minFilterModes[lVar7].mode;
        local_260 = init::minFilterModes[lVar7].name;
        uVar14 = 0x2165d01;
        lVar15 = 0;
        local_1e0 = lVar7;
        do {
          local_288 = init::magFilterModes + lVar15;
          local_258 = (TestNode *)CONCAT44(local_258._4_4_,init::magFilterModes[lVar15].mode);
          lVar7 = 0;
          local_228 = uVar14;
          do {
            local_2d0 = init::wrapModes + lVar7;
            dVar1 = init::wrapModes[lVar7].mode;
            lVar15 = 8;
            local_1d8 = lVar7;
            do {
              dVar2 = *(deUint32 *)((long)&init::wrapModes[0].name + lVar15);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_250,local_260,(allocator<char> *)local_1c8);
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
              local_2a8 = &local_298;
              plVar5 = puVar8 + 2;
              if ((long *)*puVar8 == plVar5) {
                local_298 = *plVar5;
                uStack_290 = puVar8[3];
              }
              else {
                local_298 = *plVar5;
                local_2a8 = (long *)*puVar8;
              }
              local_2a0 = puVar8[1];
              *puVar8 = plVar5;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
              local_280 = &local_270;
              puVar10 = (ulong *)(plVar5 + 2);
              if ((ulong *)*plVar5 == puVar10) {
                local_270 = *puVar10;
                lStack_268 = plVar5[3];
              }
              else {
                local_270 = *puVar10;
                local_280 = (ulong *)*plVar5;
              }
              local_278 = plVar5[1];
              *plVar5 = (long)puVar10;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_280);
              local_2f8 = &local_2e8;
              plVar5 = puVar8 + 2;
              if ((long *)*puVar8 == plVar5) {
                local_2e8 = *plVar5;
                uStack_2e0 = puVar8[3];
              }
              else {
                local_2e8 = *plVar5;
                local_2f8 = (long *)*puVar8;
              }
              local_2f0 = puVar8[1];
              *puVar8 = plVar5;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
              local_2c8 = &local_2b8;
              plVar11 = plVar5 + 2;
              if ((long *)*plVar5 == plVar11) {
                local_2b8 = *plVar11;
                lStack_2b0 = plVar5[3];
              }
              else {
                local_2b8 = *plVar11;
                local_2c8 = (long *)*plVar5;
              }
              local_2c0 = plVar5[1];
              *plVar5 = (long)plVar11;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
              name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar9) {
                name_1.field_2._M_allocated_capacity = *psVar9;
                name_1.field_2._8_8_ = plVar5[3];
              }
              else {
                name_1.field_2._M_allocated_capacity = *psVar9;
                name_1._M_dataplus._M_p = (pointer)*plVar5;
              }
              name_1._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&name_1);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar9 = (size_type *)(plVar5 + 2);
              if ((size_type *)*plVar5 == psVar9) {
                name.field_2._M_allocated_capacity = *psVar9;
                name.field_2._8_8_ = plVar5[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar9;
                name._M_dataplus._M_p = (pointer)*plVar5;
              }
              name._M_string_length = plVar5[1];
              *plVar5 = (long)psVar9;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name_1._M_dataplus._M_p != &name_1.field_2) {
                operator_delete(name_1._M_dataplus._M_p,name_1.field_2._M_allocated_capacity + 1);
              }
              if (local_2c8 != &local_2b8) {
                operator_delete(local_2c8,local_2b8 + 1);
              }
              if (local_2f8 != &local_2e8) {
                operator_delete(local_2f8,local_2e8 + 1);
              }
              if (local_280 != &local_270) {
                operator_delete(local_280,local_270 + 1);
              }
              if (local_2a8 != &local_298) {
                operator_delete(local_2a8,local_298 + 1);
              }
              if (local_250 != &local_240) {
                operator_delete(local_250,local_240 + 1);
              }
              pTVar6 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
              TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                        (pTVar6,(local_2d8->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                         ::glcts::fixed_sample_locations_values + 1,local_224,(deUint32)local_258,
                         dVar1,dVar2,0x8058,0x3f,0xc,false);
              tcu::TestNode::addChild(local_1d0,(TestNode *)pTVar6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar15 = lVar15 + 0x10;
            } while (lVar15 != 0x38);
            lVar7 = local_1d8 + 1;
          } while (lVar7 != 3);
          lVar15 = 1;
          uVar14 = 0;
        } while ((local_228 & 1) != 0);
        lVar7 = local_1e0 + 1;
      } while (lVar7 != 6);
      pTVar4 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar4,
                 (local_2d8->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "no_edges_visible","Don\'t sample anywhere near a face\'s edges");
      tcu::TestNode::addChild(local_230,pTVar4);
      uVar14 = 1;
      do {
        cVar13 = (char)uVar14;
        pTVar6 = (TextureCubeArrayFilteringCase *)operator_new(0x120);
        pcVar3 = "linear_mipmap_linear";
        if (cVar13 != '\0') {
          pcVar3 = "linear_mipmap_nearest";
        }
        TextureCubeArrayFilteringCase::TextureCubeArrayFilteringCase
                  (pTVar6,(local_2d8->super_TestCaseGroup).m_context,pcVar3 + 0xe,
                   ::glcts::fixed_sample_locations_values + 1,uVar14 ^ 0x2601,uVar14 ^ 0x2601,0x2901
                   ,0x2901,0x8058,0x3f,0xc,true);
        tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar6);
        uVar14 = 0;
      } while (cVar13 != '\0');
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		int size;
		int depth;
	} sizesCubeArray[] =
	{
		{   8,	 6 },
		{  64,	12 },
		{ 128,	12 },
		{   7,	12 },
		{  63,	18 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
	} filterableFormatsByType[] =
	{
		{ "rgba16f",		GL_RGBA16F			},
		{ "r11f_g11f_b10f",	GL_R11F_G11F_B10F	},
		{ "rgb9_e5",		GL_RGB9_E5			},
		{ "rgba8",			GL_RGBA8			},
		{ "rgba8_snorm",	GL_RGBA8_SNORM		},
		{ "rgb565",			GL_RGB565			},
		{ "rgba4",			GL_RGBA4			},
		{ "rgb5_a1",		GL_RGB5_A1			},
		{ "srgb8_alpha8",	GL_SRGB8_ALPHA8		},
		{ "rgb10_a2",		GL_RGB10_A2			}
	};

	// Cube map array texture filtering.
	{
		tcu::TestCaseGroup* const groupCubeArray = new tcu::TestCaseGroup(m_testCtx, "cube_array", "Cube Map Array Texture Filtering");
		addChild(groupCubeArray);

		// Formats.
		{
			tcu::TestCaseGroup* const formatsGroup = new tcu::TestCaseGroup(m_testCtx, "formats", "Cube Map Array Texture Formats");
			groupCubeArray->addChild(formatsGroup);

			for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(filterableFormatsByType); fmtNdx++)
			{
				for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); filterNdx++)
				{
					const deUint32	minFilter	= minFilterModes[filterNdx].mode;
					const char*		filterName	= minFilterModes[filterNdx].name;
					const deUint32	format		= filterableFormatsByType[fmtNdx].format;
					const char*		formatName	= filterableFormatsByType[fmtNdx].name;
					const bool		isMipmap	= minFilter != GL_NEAREST && minFilter != GL_LINEAR;
					const deUint32	magFilter	= isMipmap ? GL_LINEAR : minFilter;
					const string	name		= string(formatName) + "_" + filterName;
					const deUint32	wrapS		= GL_REPEAT;
					const deUint32	wrapT		= GL_REPEAT;
					const int		size		= 64;
					const int		depth		= 12;

					formatsGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																			 name.c_str(), "",
																			 minFilter, magFilter,
																			 wrapS, wrapT,
																			 format,
																			 size, depth));
				}
			}
		}

		// Sizes.
		{
			tcu::TestCaseGroup* const sizesGroup = new tcu::TestCaseGroup(m_testCtx, "sizes", "Texture Sizes");
			groupCubeArray->addChild(sizesGroup);

			for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizesCubeArray); sizeNdx++)
			{
				for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); filterNdx++)
				{
					const deUint32	minFilter	= minFilterModes[filterNdx].mode;
					const char*		filterName	= minFilterModes[filterNdx].name;
					const deUint32	format		= GL_RGBA8;
					const bool		isMipmap	= minFilter != GL_NEAREST && minFilter != GL_LINEAR;
					const deUint32	magFilter	= isMipmap ? GL_LINEAR : minFilter;
					const deUint32	wrapS		= GL_REPEAT;
					const deUint32	wrapT		= GL_REPEAT;
					const int		size		= sizesCubeArray[sizeNdx].size;
					const int		depth		= sizesCubeArray[sizeNdx].depth;
					const string	name		= de::toString(size) + "x" + de::toString(size) + "x" + de::toString(depth) + "_" + filterName;

					sizesGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																		   name.c_str(), "",
																		   minFilter, magFilter,
																		   wrapS, wrapT,
																		   format,
																		   size, depth));
				}
			}
		}

		// Wrap modes.
		{
			tcu::TestCaseGroup* const combinationsGroup = new tcu::TestCaseGroup(m_testCtx, "combinations", "Filter and wrap mode combinations");
			groupCubeArray->addChild(combinationsGroup);

			for (int minFilterNdx = 0; minFilterNdx < DE_LENGTH_OF_ARRAY(minFilterModes); minFilterNdx++)
			{
				for (int magFilterNdx = 0; magFilterNdx < DE_LENGTH_OF_ARRAY(magFilterModes); magFilterNdx++)
				{
					for (int wrapSNdx = 0; wrapSNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapSNdx++)
					{
						for (int wrapTNdx = 0; wrapTNdx < DE_LENGTH_OF_ARRAY(wrapModes); wrapTNdx++)
						{
							const deUint32	minFilter	= minFilterModes[minFilterNdx].mode;
							const deUint32	magFilter	= magFilterModes[magFilterNdx].mode;
							const deUint32	format		= GL_RGBA8;
							const deUint32	wrapS		= wrapModes[wrapSNdx].mode;
							const deUint32	wrapT		= wrapModes[wrapTNdx].mode;
							const int		size		= 63;
							const int		depth		= 12;
							const string	name		= string(minFilterModes[minFilterNdx].name) + "_" + magFilterModes[magFilterNdx].name + "_" + wrapModes[wrapSNdx].name + "_" + wrapModes[wrapTNdx].name;

							combinationsGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																						  name.c_str(), "",
																						  minFilter, magFilter,
																						  wrapS, wrapT,
																						  format,
																						  size, depth));
						}
					}
				}
			}
		}

		// Cases with no visible cube edges.
		{
			tcu::TestCaseGroup* const onlyFaceInteriorGroup = new tcu::TestCaseGroup(m_testCtx, "no_edges_visible", "Don't sample anywhere near a face's edges");
			groupCubeArray->addChild(onlyFaceInteriorGroup);

			for (int isLinearI = 0; isLinearI <= 1; isLinearI++)
			{
				const bool		isLinear	= isLinearI != 0;
				const deUint32	filter		= isLinear ? GL_LINEAR : GL_NEAREST;

				onlyFaceInteriorGroup->addChild(new TextureCubeArrayFilteringCase(m_context,
																				  isLinear ? "linear" : "nearest", "",
																				  filter, filter,
																				  GL_REPEAT, GL_REPEAT,
																				  GL_RGBA8,
																				  63, 12,
																				  true));
			}
		}
	}
}